

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

ssize_t __thiscall
booster::aio::stream_socket::writev(stream_socket *this,int __fd,iovec *__iovec,int __count)

{
  native_type __fd_00;
  int *piVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar4;
  iovec vec [16];
  
  pVar4 = buffer_impl<const_char_*>::get
                    ((buffer_impl<const_char_*> *)CONCAT44(in_register_00000034,__fd));
  uVar3 = 0x10;
  if (pVar4.second < 0x10) {
    uVar3 = pVar4.second;
  }
  for (uVar2 = 0; (uint)((int)uVar3 << 4) != uVar2; uVar2 = uVar2 + 0x10) {
    *(undefined8 *)((long)&vec[0].iov_base + uVar2) =
         *(undefined8 *)((long)&(pVar4.first)->ptr + uVar2);
    *(undefined8 *)((long)&vec[0].iov_len + uVar2) =
         *(undefined8 *)((long)&(pVar4.first)->size + uVar2);
  }
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    uVar2 = ::writev(__fd_00,(iovec *)vec,(int)uVar3);
    if (-1 < (int)uVar2) break;
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  return uVar2 & 0xffffffff;
}

Assistant:

int stream_socket::writev(const_buffer const &b)
{
	static const unsigned max_vec_size = 16;
	const_buffer::buffer_data_type data = b.get();
	unsigned size=0;
#ifndef BOOSTER_WIN32
	struct iovec vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].iov_base = const_cast<char *>(data.first[size].ptr);
		vec[size].iov_len = data.first[size].size;
	}
	for(;;) {
		int ret = ::writev(native(),vec,size);
		if(ret >= 0)
			return ret;
		if(ret < 0 && errno==EINTR)
			continue;
		return ret;
	}
#else // Win32
	WSABUF vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].buf = const_cast<char *>(data.first[size].ptr);
		vec[size].len = data.first[size].size;
	}
	DWORD send=0;
	int res = ::WSASend(native(),vec,size,&send,0,0,0);
	if(res == 0)
		return send;
	return -1;
#endif
}